

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O1

void __thiscall amrex::EB2::Level::buildCellFlag(Level *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  bool bVar37;
  Periodicity PVar38;
  MFIter mfi;
  Box local_1ac;
  Array4<amrex::EBCellFlag> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  lVar21 = 0xd48;
  do {
    local_90.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
          0x100000001;
    local_90.fabArray._0_4_ = 1;
    PVar38 = Geometry::periodicity(&this->m_geom);
    local_190.p = PVar38.period.vect._0_8_;
    local_190.jstride._0_4_ = PVar38.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               ((long)(this->m_geom).super_CoordSys.offset + lVar21 + -8),0,1,(IntVect *)&local_90,
               (Periodicity *)&local_190,false);
    lVar21 = lVar21 + 0x180;
  } while (lVar21 != 0x11c8);
  MFIter::MFIter(&local_90,&(this->m_cellflag).super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_1ac,&local_90);
      FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                (&local_190,&this->m_cellflag,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,(FabArray<amrex::FArrayBox> *)&this->m_areafrac,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&(this->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                 &local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&(this->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                 &local_90);
      if (local_1ac.smallend.vect[2] <= local_1ac.bigend.vect[2]) {
        iVar7 = local_1ac.smallend.vect[2];
        do {
          if (local_1ac.smallend.vect[1] <= local_1ac.bigend.vect[1]) {
            iVar9 = iVar7 + 1;
            iVar8 = local_1ac.smallend.vect[1];
            do {
              if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
                iVar10 = iVar8 + 1;
                iVar34 = local_1ac.smallend.vect[0];
                do {
                  lVar21 = ((long)iVar8 - (long)local_190.begin.y) *
                           CONCAT44(local_190.jstride._4_4_,(int)local_190.jstride);
                  lVar35 = ((long)iVar7 - (long)local_190.begin.z) * local_190.kstride;
                  uVar23 = local_190.p[lVar21 + (iVar34 - local_190.begin.x) + lVar35].flag & 0x1f;
                  if ((~local_190.p[lVar21 + (iVar34 - local_190.begin.x) + lVar35].flag & 3) != 0)
                  {
                    lVar25 = (long)(iVar34 - local_d0.begin.x);
                    lVar18 = (iVar8 - local_d0.begin.y) * local_d0.jstride;
                    lVar15 = (iVar7 - local_d0.begin.z) * local_d0.kstride;
                    dVar1 = local_d0.p[lVar18 + lVar25 + lVar15];
                    lVar12 = (long)((iVar34 - local_d0.begin.x) + 1);
                    dVar2 = local_d0.p[lVar18 + lVar12 + lVar15];
                    iVar24 = iVar34 - local_110.begin.x;
                    lVar26 = (long)iVar24;
                    lVar29 = (iVar8 - local_110.begin.y) * local_110.jstride;
                    lVar33 = (iVar7 - local_110.begin.z) * local_110.kstride;
                    dVar3 = local_110.p[lVar29 + lVar26 + lVar33];
                    lVar13 = (iVar10 - local_110.begin.y) * local_110.jstride;
                    dVar4 = local_110.p[lVar13 + lVar26 + lVar33];
                    iVar11 = iVar34 - local_150.begin.x;
                    lVar36 = (iVar8 - local_150.begin.y) * local_150.jstride;
                    lVar27 = (iVar7 - local_150.begin.z) * local_150.kstride;
                    lVar19 = (long)iVar11;
                    dVar5 = local_150.p[lVar36 + lVar19 + lVar27];
                    lVar31 = (iVar9 - local_150.begin.z) * local_150.kstride;
                    dVar6 = local_150.p[lVar36 + lVar19 + lVar31];
                    uVar23 = (-(uint)(dVar6 != 0.0) & 1) << 0x1b |
                             (-(uint)(dVar5 != 0.0) & 1) << 9 |
                             (-(uint)(dVar4 != 0.0) & 1) << 0x15 |
                             (-(uint)(dVar3 != 0.0) & 1) << 0xf |
                             (-(uint)(dVar2 != 0.0) & 1) << 0x13 |
                             (-(uint)(dVar1 != 0.0) & 1) << 0x11 | uVar23 | 0x40000;
                    uVar16 = ~local_d0.begin.y;
                    uVar28 = ~local_150.begin.x;
                    uVar17 = ~local_150.begin.y;
                    uVar14 = ~local_110.begin.x;
                    if ((((dVar1 != 0.0) || (NAN(dVar1))) &&
                        ((local_110.p[lVar29 + (int)(iVar34 + uVar14) + lVar33] != 0.0 ||
                         (NAN(local_110.p[lVar29 + (int)(iVar34 + uVar14) + lVar33]))))) ||
                       (((dVar3 != 0.0 || (NAN(dVar3))) &&
                        ((local_d0.p[(int)(uVar16 + iVar8) * local_d0.jstride + lVar25 + lVar15] !=
                          0.0 || (NAN(local_d0.p
                                      [(int)(uVar16 + iVar8) * local_d0.jstride + lVar25 + lVar15]))
                         ))))) {
                      lVar22 = (int)(iVar8 + uVar17) * local_150.jstride;
                      uVar20 = (-(uint)(local_150.p[lVar22 + (int)(uVar28 + iVar34) + lVar27] != 0.0
                                       ) & 1) << 5 | uVar23;
                      uVar23 = uVar20 | 0x4000;
                      if ((local_150.p[lVar22 + (int)(uVar28 + iVar34) + lVar31] != 0.0) ||
                         (NAN(local_150.p[lVar22 + (int)(uVar28 + iVar34) + lVar31]))) {
                        uVar23 = uVar20 | 0x804000;
                      }
                    }
                    if ((((dVar2 != 0.0) || (NAN(dVar2))) &&
                        ((local_110.p[lVar29 + (iVar24 + 1) + lVar33] != 0.0 ||
                         (NAN(local_110.p[lVar29 + (iVar24 + 1) + lVar33]))))) ||
                       (((dVar3 != 0.0 || (NAN(dVar3))) &&
                        ((local_d0.p[(int)(uVar16 + iVar8) * local_d0.jstride + lVar12 + lVar15] !=
                          0.0 || (NAN(local_d0.p
                                      [(int)(uVar16 + iVar8) * local_d0.jstride + lVar12 + lVar15]))
                         ))))) {
                      lVar22 = (int)(iVar8 + uVar17) * local_150.jstride;
                      uVar20 = (-(uint)(local_150.p[lVar22 + (iVar11 + 1) + lVar27] != 0.0) & 1) <<
                               7 | uVar23;
                      uVar23 = uVar20 | 0x10000;
                      if ((local_150.p[lVar22 + (iVar11 + 1) + lVar31] != 0.0) ||
                         (NAN(local_150.p[lVar22 + (iVar11 + 1) + lVar31]))) {
                        uVar23 = uVar20 | 0x2010000;
                      }
                    }
                    if ((((dVar1 != 0.0) || (NAN(dVar1))) &&
                        ((local_110.p[lVar13 + (int)(iVar34 + uVar14) + lVar33] != 0.0 ||
                         (NAN(local_110.p[lVar13 + (int)(iVar34 + uVar14) + lVar33]))))) ||
                       (((dVar4 != 0.0 || (NAN(dVar4))) &&
                        ((local_d0.p
                          [(iVar10 - local_d0.begin.y) * local_d0.jstride + lVar25 + lVar15] != 0.0
                         || (NAN(local_d0.p
                                 [(iVar10 - local_d0.begin.y) * local_d0.jstride + lVar25 + lVar15])
                            )))))) {
                      lVar22 = (iVar10 - local_150.begin.y) * local_150.jstride;
                      uVar20 = (-(uint)(local_150.p[lVar22 + (int)(uVar28 + iVar34) + lVar27] != 0.0
                                       ) & 1) << 0xb | uVar23;
                      uVar23 = uVar20 | 0x100000;
                      if ((local_150.p[lVar22 + (int)(uVar28 + iVar34) + lVar31] != 0.0) ||
                         (NAN(local_150.p[lVar22 + (int)(uVar28 + iVar34) + lVar31]))) {
                        uVar23 = uVar20 | 0x20100000;
                      }
                    }
                    if ((((dVar2 != 0.0) || (NAN(dVar2))) &&
                        ((local_110.p[lVar13 + (iVar24 + 1) + lVar33] != 0.0 ||
                         (NAN(local_110.p[lVar13 + (iVar24 + 1) + lVar33]))))) ||
                       (((dVar4 != 0.0 || (NAN(dVar4))) &&
                        ((local_d0.p
                          [(iVar10 - local_d0.begin.y) * local_d0.jstride + lVar12 + lVar15] != 0.0
                         || (NAN(local_d0.p
                                 [(iVar10 - local_d0.begin.y) * local_d0.jstride + lVar12 + lVar15])
                            )))))) {
                      lVar15 = (iVar10 - local_150.begin.y) * local_150.jstride;
                      uVar20 = (-(uint)(local_150.p[lVar15 + (iVar11 + 1) + lVar27] != 0.0) & 1) <<
                               0xd | uVar23;
                      uVar23 = uVar20 | 0x400000;
                      if ((local_150.p[lVar15 + (iVar11 + 1) + lVar31] != 0.0) ||
                         (NAN(local_150.p[lVar15 + (iVar11 + 1) + lVar31]))) {
                        uVar23 = uVar20 | 0x80400000;
                      }
                    }
                    uVar32 = ~local_d0.begin.z;
                    uVar20 = ~local_110.begin.z;
                    if ((((dVar1 != 0.0) || (NAN(dVar1))) &&
                        ((local_150.p[lVar36 + (int)(uVar28 + iVar34) + lVar27] != 0.0 ||
                         (NAN(local_150.p[lVar36 + (int)(uVar28 + iVar34) + lVar27]))))) ||
                       (((dVar5 != 0.0 || (NAN(dVar5))) &&
                        ((local_d0.p[lVar18 + lVar25 + (int)(iVar7 + uVar32) * local_d0.kstride] !=
                          0.0 || (NAN(local_d0.p
                                      [lVar18 + lVar25 + (int)(iVar7 + uVar32) * local_d0.kstride]))
                         ))))) {
                      lVar15 = (int)(iVar7 + uVar20) * local_110.kstride;
                      uVar30 = (-(uint)(local_110.p[lVar29 + (int)(iVar34 + uVar14) + lVar15] != 0.0
                                       ) & 1) << 5 | uVar23;
                      uVar23 = uVar30 | 0x100;
                      if ((local_110.p[lVar13 + (int)(iVar34 + uVar14) + lVar15] != 0.0) ||
                         (NAN(local_110.p[lVar13 + (int)(iVar34 + uVar14) + lVar15]))) {
                        uVar23 = uVar30 | 0x900;
                      }
                    }
                    if ((((dVar2 != 0.0) || (NAN(dVar2))) &&
                        ((local_150.p[lVar36 + (iVar11 + 1) + lVar27] != 0.0 ||
                         (NAN(local_150.p[lVar36 + (iVar11 + 1) + lVar27]))))) ||
                       (((dVar5 != 0.0 || (NAN(dVar5))) &&
                        ((local_d0.p[lVar18 + lVar12 + (int)(iVar7 + uVar32) * local_d0.kstride] !=
                          0.0 || (NAN(local_d0.p
                                      [lVar18 + lVar12 + (int)(iVar7 + uVar32) * local_d0.kstride]))
                         ))))) {
                      lVar15 = (int)(iVar7 + uVar20) * local_110.kstride;
                      uVar30 = (-(uint)(local_110.p[lVar29 + (iVar24 + 1) + lVar15] != 0.0) & 1) <<
                               7 | uVar23;
                      uVar23 = uVar30 | 0x400;
                      if ((local_110.p[lVar13 + (iVar24 + 1) + lVar15] != 0.0) ||
                         (NAN(local_110.p[lVar13 + (iVar24 + 1) + lVar15]))) {
                        uVar23 = uVar30 | 0x2400;
                      }
                    }
                    if ((((dVar1 != 0.0) || (NAN(dVar1))) &&
                        ((local_150.p[lVar36 + (int)(uVar28 + iVar34) + lVar31] != 0.0 ||
                         (NAN(local_150.p[lVar36 + (int)(uVar28 + iVar34) + lVar31]))))) ||
                       (((dVar6 != 0.0 || (NAN(dVar6))) &&
                        ((local_d0.p
                          [lVar18 + lVar25 + (iVar9 - local_d0.begin.z) * local_d0.kstride] != 0.0
                         || (NAN(local_d0.p
                                 [lVar18 + lVar25 + (iVar9 - local_d0.begin.z) * local_d0.kstride]))
                         ))))) {
                      lVar15 = (iVar9 - local_110.begin.z) * local_110.kstride;
                      uVar28 = (-(uint)(local_110.p[lVar29 + (int)(uVar14 + iVar34) + lVar15] != 0.0
                                       ) & 1) << 0x17 | uVar23;
                      uVar23 = uVar28 | 0x4000000;
                      if ((local_110.p[lVar13 + (int)(uVar14 + iVar34) + lVar15] != 0.0) ||
                         (NAN(local_110.p[lVar13 + (int)(uVar14 + iVar34) + lVar15]))) {
                        uVar23 = uVar28 | 0x24000000;
                      }
                    }
                    if ((((dVar2 != 0.0) || (NAN(dVar2))) &&
                        ((local_150.p[lVar36 + (iVar11 + 1) + lVar31] != 0.0 ||
                         (NAN(local_150.p[lVar36 + (iVar11 + 1) + lVar31]))))) ||
                       (((dVar6 != 0.0 || (NAN(dVar6))) &&
                        ((local_d0.p
                          [lVar18 + lVar12 + (iVar9 - local_d0.begin.z) * local_d0.kstride] != 0.0
                         || (NAN(local_d0.p
                                 [lVar18 + lVar12 + (iVar9 - local_d0.begin.z) * local_d0.kstride]))
                         ))))) {
                      lVar15 = (iVar9 - local_110.begin.z) * local_110.kstride;
                      uVar14 = (-(uint)(local_110.p[lVar29 + (iVar24 + 1) + lVar15] != 0.0) & 1) <<
                               0x19 | uVar23;
                      uVar23 = uVar14 | 0x10000000;
                      if ((local_110.p[lVar13 + (iVar24 + 1) + lVar15] != 0.0) ||
                         (NAN(local_110.p[lVar13 + (iVar24 + 1) + lVar15]))) {
                        uVar23 = uVar14 | 0x90000000;
                      }
                    }
                    if ((((dVar3 != 0.0) || (NAN(dVar3))) &&
                        ((local_150.p[(int)(uVar17 + iVar8) * local_150.jstride + lVar19 + lVar27]
                          != 0.0 ||
                         (NAN(local_150.p
                              [(int)(uVar17 + iVar8) * local_150.jstride + lVar19 + lVar27]))))) ||
                       (((dVar5 != 0.0 || (NAN(dVar5))) &&
                        ((local_110.p[lVar29 + lVar26 + (int)(iVar7 + uVar20) * local_110.kstride]
                          != 0.0 ||
                         (NAN(local_110.p
                              [lVar29 + lVar26 + (int)(iVar7 + uVar20) * local_110.kstride]))))))) {
                      lVar15 = (int)(uVar16 + iVar8) * local_d0.jstride;
                      lVar18 = (int)(iVar7 + uVar32) * local_d0.kstride;
                      uVar14 = (-(uint)(local_d0.p[lVar15 + lVar25 + lVar18] != 0.0) & 1) << 5 |
                               uVar23;
                      uVar23 = uVar14 | 0x40;
                      if ((local_d0.p[lVar15 + lVar12 + lVar18] != 0.0) ||
                         (NAN(local_d0.p[lVar15 + lVar12 + lVar18]))) {
                        uVar23 = uVar14 | 0xc0;
                      }
                    }
                    if ((((dVar4 != 0.0) || (NAN(dVar4))) &&
                        ((local_150.p
                          [(iVar10 - local_150.begin.y) * local_150.jstride + lVar19 + lVar27] !=
                          0.0 || (NAN(local_150.p
                                      [(iVar10 - local_150.begin.y) * local_150.jstride +
                                       lVar19 + lVar27]))))) ||
                       (((dVar5 != 0.0 || (NAN(dVar5))) &&
                        ((local_110.p[lVar13 + lVar26 + (int)(uVar20 + iVar7) * local_110.kstride]
                          != 0.0 ||
                         (NAN(local_110.p
                              [lVar13 + lVar26 + (int)(uVar20 + iVar7) * local_110.kstride]))))))) {
                      lVar15 = (iVar10 - local_d0.begin.y) * local_d0.jstride;
                      lVar18 = (int)(uVar32 + iVar7) * local_d0.kstride;
                      uVar14 = (-(uint)(local_d0.p[lVar15 + lVar25 + lVar18] != 0.0) & 1) << 0xb |
                               uVar23;
                      uVar23 = uVar14 | 0x1000;
                      if ((local_d0.p[lVar15 + lVar12 + lVar18] != 0.0) ||
                         (NAN(local_d0.p[lVar15 + lVar12 + lVar18]))) {
                        uVar23 = uVar14 | 0x3000;
                      }
                    }
                    if ((((dVar3 != 0.0) || (NAN(dVar3))) &&
                        ((local_150.p[(int)(uVar17 + iVar8) * local_150.jstride + lVar19 + lVar31]
                          != 0.0 ||
                         (NAN(local_150.p
                              [(int)(uVar17 + iVar8) * local_150.jstride + lVar19 + lVar31]))))) ||
                       (((dVar6 != 0.0 || (NAN(dVar6))) &&
                        ((local_110.p
                          [lVar29 + lVar26 + (iVar9 - local_110.begin.z) * local_110.kstride] != 0.0
                         || (NAN(local_110.p
                                 [lVar29 + lVar26 + (iVar9 - local_110.begin.z) * local_110.kstride]
                                ))))))) {
                      lVar15 = (int)(uVar16 + iVar8) * local_d0.jstride;
                      lVar18 = (iVar9 - local_d0.begin.z) * local_d0.kstride;
                      uVar14 = (-(uint)(local_d0.p[lVar15 + lVar25 + lVar18] != 0.0) & 1) << 0x17 |
                               uVar23;
                      uVar23 = uVar14 | 0x1000000;
                      if ((local_d0.p[lVar15 + lVar12 + lVar18] != 0.0) ||
                         (NAN(local_d0.p[lVar15 + lVar12 + lVar18]))) {
                        uVar23 = uVar14 | 0x3000000;
                      }
                    }
                    if ((((dVar4 != 0.0) || (NAN(dVar4))) &&
                        ((local_150.p
                          [(iVar10 - local_150.begin.y) * local_150.jstride + lVar19 + lVar31] !=
                          0.0 || (NAN(local_150.p
                                      [(iVar10 - local_150.begin.y) * local_150.jstride +
                                       lVar19 + lVar31]))))) ||
                       (((dVar6 != 0.0 || (NAN(dVar6))) &&
                        ((local_110.p
                          [lVar13 + lVar26 + (iVar9 - local_110.begin.z) * local_110.kstride] != 0.0
                         || (NAN(local_110.p
                                 [lVar13 + lVar26 + (iVar9 - local_110.begin.z) * local_110.kstride]
                                ))))))) {
                      lVar13 = (iVar10 - local_d0.begin.y) * local_d0.jstride;
                      lVar15 = (iVar9 - local_d0.begin.z) * local_d0.kstride;
                      uVar14 = (-(uint)(local_d0.p[lVar13 + lVar25 + lVar15] != 0.0) & 1) << 0x1d |
                               uVar23;
                      uVar23 = uVar14 | 0x40000000;
                      if ((local_d0.p[lVar13 + lVar12 + lVar15] != 0.0) ||
                         (NAN(local_d0.p[lVar13 + lVar12 + lVar15]))) {
                        uVar23 = uVar14 | 0xc0000000;
                      }
                    }
                  }
                  local_190.p[lVar21 + (iVar34 - local_190.begin.x) + lVar35].flag = uVar23;
                  iVar34 = iVar34 + 1;
                } while (local_1ac.bigend.vect[0] + 1 != iVar34);
              }
              bVar37 = iVar8 != local_1ac.bigend.vect[1];
              iVar8 = iVar8 + 1;
            } while (bVar37);
          }
          bVar37 = iVar7 != local_1ac.bigend.vect[2];
          iVar7 = iVar7 + 1;
        } while (bVar37);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
Level::buildCellFlag ()
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].FillBoundary(0,1,{AMREX_D_DECL(1,1,1)},m_geom.periodicity());
    }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(m_cellflag,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& cflag = m_cellflag.array(mfi);
        AMREX_D_TERM(auto const& apx = m_areafrac[0].const_array(mfi);,
                     auto const& apy = m_areafrac[1].const_array(mfi);,
                     auto const& apz = m_areafrac[2].const_array(mfi););
        AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
        {
            amrex::ignore_unused(k);
            build_cellflag_from_ap(AMREX_D_DECL(i,j,k),
                                   cflag, AMREX_D_DECL(apx,apy,apz));
        });
    }
}